

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_layer2.c
# Opt level: O0

_Bool oonf_layer2_net_commit(oonf_layer2_net *l2net)

{
  bool bVar1;
  ulong local_30;
  size_t i;
  oonf_layer2_net *l2net_local;
  
  if ((l2net->neighbors).count == 0) {
    for (local_30 = 0; local_30 < 0x10; local_30 = local_30 + 1) {
      bVar1 = false;
      if (l2net->data[local_30]._origin != (oonf_layer2_origin *)0x0) {
        bVar1 = l2net->data[local_30]._meta != (oonf_layer2_metadata *)0x0;
      }
      if (bVar1) {
        oonf_class_event(&_l2network_class,l2net,OONF_OBJECT_CHANGED);
        return false;
      }
    }
    for (local_30 = 0; local_30 < 0x1a; local_30 = local_30 + 1) {
      bVar1 = false;
      if (l2net->neighdata[local_30]._origin != (oonf_layer2_origin *)0x0) {
        bVar1 = l2net->neighdata[local_30]._meta != (oonf_layer2_metadata *)0x0;
      }
      if (bVar1) {
        oonf_class_event(&_l2network_class,l2net,OONF_OBJECT_CHANGED);
        return false;
      }
    }
    _net_remove(l2net);
    l2net_local._7_1_ = true;
  }
  else {
    oonf_class_event(&_l2network_class,l2net,OONF_OBJECT_CHANGED);
    l2net_local._7_1_ = false;
  }
  return l2net_local._7_1_;
}

Assistant:

bool
oonf_layer2_net_commit(struct oonf_layer2_net *l2net) {
  size_t i;

  if (l2net->neighbors.count > 0) {
    oonf_class_event(&_l2network_class, l2net, OONF_OBJECT_CHANGED);
    return false;
  }

  for (i = 0; i < OONF_LAYER2_NET_COUNT; i++) {
    if (oonf_layer2_data_has_value(&l2net->data[i])) {
      oonf_class_event(&_l2network_class, l2net, OONF_OBJECT_CHANGED);
      return false;
    }
  }

  for (i = 0; i < OONF_LAYER2_NEIGH_COUNT; i++) {
    if (oonf_layer2_data_has_value(&l2net->neighdata[i])) {
      oonf_class_event(&_l2network_class, l2net, OONF_OBJECT_CHANGED);
      return false;
    }
  }

  _net_remove(l2net);
  return true;
}